

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarTable.cpp
# Opt level: O3

string * ltrim(string *s)

{
  byte bVar1;
  ulong uVar2;
  pointer pcVar3;
  locale *plVar4;
  ctype *pcVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  
  pbVar9 = (byte *)(s->_M_dataplus)._M_p;
  uVar2 = s->_M_string_length;
  pbVar7 = pbVar9;
  if (0 < (long)uVar2 >> 2) {
    pbVar7 = pbVar9 + (uVar2 & 0xfffffffffffffffc);
    lVar6 = ((long)uVar2 >> 2) + 1;
    pbVar8 = pbVar9 + 3;
    do {
      bVar1 = pbVar8[-3];
      plVar4 = (locale *)std::locale::classic();
      pcVar5 = std::use_facet<std::ctype<char>>(plVar4);
      if ((*(byte *)(*(long *)(pcVar5 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) {
        pbVar8 = pbVar8 + -3;
        goto LAB_00105d7b;
      }
      bVar1 = pbVar8[-2];
      plVar4 = (locale *)std::locale::classic();
      pcVar5 = std::use_facet<std::ctype<char>>(plVar4);
      if ((*(byte *)(*(long *)(pcVar5 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) {
        pbVar8 = pbVar8 + -2;
        goto LAB_00105d7b;
      }
      bVar1 = pbVar8[-1];
      plVar4 = (locale *)std::locale::classic();
      pcVar5 = std::use_facet<std::ctype<char>>(plVar4);
      if ((*(byte *)(*(long *)(pcVar5 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) {
        pbVar8 = pbVar8 + -1;
        goto LAB_00105d7b;
      }
      bVar1 = *pbVar8;
      plVar4 = (locale *)std::locale::classic();
      pcVar5 = std::use_facet<std::ctype<char>>(plVar4);
      if ((*(byte *)(*(long *)(pcVar5 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0)
      goto LAB_00105d7b;
      lVar6 = lVar6 + -1;
      pbVar8 = pbVar8 + 4;
    } while (1 < lVar6);
  }
  pbVar9 = pbVar9 + uVar2;
  lVar6 = (long)pbVar9 - (long)pbVar7;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pbVar8 = pbVar9;
      if (lVar6 != 3) goto LAB_00105d7b;
      bVar1 = *pbVar7;
      plVar4 = (locale *)std::locale::classic();
      pcVar5 = std::use_facet<std::ctype<char>>(plVar4);
      pbVar8 = pbVar7;
      if ((*(byte *)(*(long *)(pcVar5 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0)
      goto LAB_00105d7b;
      pbVar7 = pbVar7 + 1;
    }
    bVar1 = *pbVar7;
    plVar4 = (locale *)std::locale::classic();
    pcVar5 = std::use_facet<std::ctype<char>>(plVar4);
    pbVar8 = pbVar7;
    if ((*(byte *)(*(long *)(pcVar5 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) goto LAB_00105d7b;
    pbVar7 = pbVar7 + 1;
  }
  bVar1 = *pbVar7;
  plVar4 = (locale *)std::locale::classic();
  pcVar5 = std::use_facet<std::ctype<char>>(plVar4);
  pbVar8 = pbVar9;
  if ((*(byte *)(*(long *)(pcVar5 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) {
    pbVar8 = pbVar7;
  }
LAB_00105d7b:
  pcVar3 = (s->_M_dataplus)._M_p;
  if ((byte *)(pcVar3 + s->_M_string_length) == pbVar8) {
    s->_M_string_length = 0;
    *pcVar3 = '\0';
  }
  else {
    std::__cxx11::string::_M_erase((ulong)s,0);
  }
  return s;
}

Assistant:

std::string &ltrim(std::string &s)
{
    auto it = std::find_if(s.begin(), s.end(),
                           [](char c)
                           {
                               return !std::isspace<char>(c, std::locale::classic());
                           });
    s.erase(s.begin(), it);
    return s;
}